

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_codestream_index_t * j2k_get_cstr_index(opj_j2k_v2_t *p_j2k)

{
  opj_marker_info_t *poVar1;
  opj_tile_index_t *poVar2;
  opj_tp_index_t *poVar3;
  long in_RDI;
  OPJ_UINT32 it_tile_free_1;
  OPJ_UINT32 it_tile_free;
  OPJ_UINT32 it_tile;
  opj_codestream_index_t *l_cstr_index;
  uint local_24;
  uint local_20;
  uint local_1c;
  opj_codestream_index_t *local_8;
  
  local_8 = (opj_codestream_index_t *)calloc(1,0x38);
  if (local_8 == (opj_codestream_index_t *)0x0) {
    local_8 = (opj_codestream_index_t *)0x0;
  }
  else {
    local_8->main_head_start = **(OPJ_OFF_T **)(in_RDI + 0x110);
    local_8->main_head_end = *(OPJ_OFF_T *)(*(long *)(in_RDI + 0x110) + 8);
    local_8->codestream_size = *(OPJ_UINT64 *)(*(long *)(in_RDI + 0x110) + 0x10);
    local_8->marknum = *(OPJ_UINT32 *)(*(long *)(in_RDI + 0x110) + 0x18);
    poVar1 = (opj_marker_info_t *)malloc((ulong)local_8->marknum * 0x18);
    local_8->marker = poVar1;
    if (local_8->marker == (opj_marker_info_t *)0x0) {
      free(local_8);
      local_8 = (opj_codestream_index_t *)0x0;
    }
    else {
      if (*(long *)(*(long *)(in_RDI + 0x110) + 0x20) == 0) {
        free(local_8->marker);
        local_8->marker = (opj_marker_info_t *)0x0;
      }
      else {
        memcpy(local_8->marker,*(void **)(*(long *)(in_RDI + 0x110) + 0x20),
               (ulong)local_8->marknum * 0x18);
      }
      local_8->nb_of_tiles = *(OPJ_UINT32 *)(*(long *)(in_RDI + 0x110) + 0x2c);
      poVar2 = (opj_tile_index_t *)calloc((ulong)local_8->nb_of_tiles,0x38);
      local_8->tile_index = poVar2;
      if (local_8->tile_index == (opj_tile_index_t *)0x0) {
        free(local_8->marker);
        free(local_8);
        local_8 = (opj_codestream_index_t *)0x0;
      }
      else if (*(long *)(*(long *)(in_RDI + 0x110) + 0x30) == 0) {
        free(local_8->tile_index);
        local_8->tile_index = (opj_tile_index_t *)0x0;
      }
      else {
        for (local_1c = 0; local_1c < local_8->nb_of_tiles; local_1c = local_1c + 1) {
          local_8->tile_index[local_1c].marknum =
               *(OPJ_UINT32 *)
                (*(long *)(*(long *)(in_RDI + 0x110) + 0x30) + (ulong)local_1c * 0x38 + 0x18);
          poVar1 = (opj_marker_info_t *)malloc((ulong)local_8->tile_index[local_1c].marknum * 0x18);
          local_8->tile_index[local_1c].marker = poVar1;
          if (local_8->tile_index[local_1c].marker == (opj_marker_info_t *)0x0) {
            for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
              free(local_8->tile_index[local_20].marker);
            }
            free(local_8->tile_index);
            free(local_8->marker);
            free(local_8);
            return (opj_codestream_index_t *)0x0;
          }
          if (*(long *)(*(long *)(*(long *)(in_RDI + 0x110) + 0x30) + (ulong)local_1c * 0x38 + 0x20)
              == 0) {
            free(local_8->tile_index[local_1c].marker);
            local_8->tile_index[local_1c].marker = (opj_marker_info_t *)0x0;
          }
          else {
            memcpy(local_8->tile_index[local_1c].marker,
                   *(void **)(*(long *)(*(long *)(in_RDI + 0x110) + 0x30) + (ulong)local_1c * 0x38 +
                             0x20),(ulong)local_8->tile_index[local_1c].marknum * 0x18);
          }
          local_8->tile_index[local_1c].nb_tps =
               *(OPJ_UINT32 *)
                (*(long *)(*(long *)(in_RDI + 0x110) + 0x30) + (ulong)local_1c * 0x38 + 4);
          poVar3 = (opj_tp_index_t *)malloc((ulong)local_8->tile_index[local_1c].nb_tps * 0x18);
          local_8->tile_index[local_1c].tp_index = poVar3;
          if (local_8->tile_index[local_1c].tp_index == (opj_tp_index_t *)0x0) {
            for (local_24 = 0; local_24 < local_1c; local_24 = local_24 + 1) {
              free(local_8->tile_index[local_24].marker);
              free(local_8->tile_index[local_24].tp_index);
            }
            free(local_8->tile_index);
            free(local_8->marker);
            free(local_8);
            return (opj_codestream_index_t *)0x0;
          }
          if (*(long *)(*(long *)(*(long *)(in_RDI + 0x110) + 0x30) + (ulong)local_1c * 0x38 + 0x10)
              == 0) {
            free(local_8->tile_index[local_1c].tp_index);
            local_8->tile_index[local_1c].tp_index = (opj_tp_index_t *)0x0;
          }
          else {
            memcpy(local_8->tile_index[local_1c].tp_index,
                   *(void **)(*(long *)(*(long *)(in_RDI + 0x110) + 0x30) + (ulong)local_1c * 0x38 +
                             0x10),(ulong)local_8->tile_index[local_1c].nb_tps * 0x18);
          }
          local_8->tile_index[local_1c].nb_packet = 0;
          local_8->tile_index[local_1c].packet_index = (opj_packet_info_t *)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

opj_codestream_index_t* j2k_get_cstr_index(opj_j2k_v2_t* p_j2k)
{
 	opj_codestream_index_t* l_cstr_index = (opj_codestream_index_t*)
			opj_calloc(1,sizeof(opj_codestream_index_t));
	if (!l_cstr_index)
		return NULL;

	l_cstr_index->main_head_start = p_j2k->cstr_index->main_head_start;
	l_cstr_index->main_head_end = p_j2k->cstr_index->main_head_end;
	l_cstr_index->codestream_size = p_j2k->cstr_index->codestream_size;

	l_cstr_index->marknum = p_j2k->cstr_index->marknum;
	l_cstr_index->marker = (opj_marker_info_t*)opj_malloc(l_cstr_index->marknum*sizeof(opj_marker_info_t));
	if (!l_cstr_index->marker){
		opj_free( l_cstr_index);
		return NULL;
	}

	if (p_j2k->cstr_index->marker)
		memcpy(l_cstr_index->marker, p_j2k->cstr_index->marker, l_cstr_index->marknum * sizeof(opj_marker_info_t) );
	else{
		opj_free(l_cstr_index->marker);
		l_cstr_index->marker = NULL;
	}

	l_cstr_index->nb_of_tiles = p_j2k->cstr_index->nb_of_tiles;
	l_cstr_index->tile_index = (opj_tile_index_t*)opj_calloc(l_cstr_index->nb_of_tiles, sizeof(opj_tile_index_t) );
	if (!l_cstr_index->tile_index){
		opj_free( l_cstr_index->marker);
		opj_free( l_cstr_index);
		return NULL;
	}

	if (!p_j2k->cstr_index->tile_index){
		opj_free(l_cstr_index->tile_index);
		l_cstr_index->tile_index = NULL;
	}
	else {
		OPJ_UINT32 it_tile = 0;
		for (it_tile = 0; it_tile < l_cstr_index->nb_of_tiles; it_tile++ ){

			/* Tile Marker*/
			l_cstr_index->tile_index[it_tile].marknum = p_j2k->cstr_index->tile_index[it_tile].marknum;

			l_cstr_index->tile_index[it_tile].marker =
				(opj_marker_info_t*)opj_malloc(l_cstr_index->tile_index[it_tile].marknum*sizeof(opj_marker_info_t));

			if (!l_cstr_index->tile_index[it_tile].marker) {
				OPJ_UINT32 it_tile_free;

				for (it_tile_free=0; it_tile_free < it_tile; it_tile_free++){
					opj_free(l_cstr_index->tile_index[it_tile_free].marker);
				}

				opj_free( l_cstr_index->tile_index);
				opj_free( l_cstr_index->marker);
				opj_free( l_cstr_index);
				return NULL;
			}

			if (p_j2k->cstr_index->tile_index[it_tile].marker)
				memcpy(	l_cstr_index->tile_index[it_tile].marker,
						p_j2k->cstr_index->tile_index[it_tile].marker,
						l_cstr_index->tile_index[it_tile].marknum * sizeof(opj_marker_info_t) );
			else{
				opj_free(l_cstr_index->tile_index[it_tile].marker);
				l_cstr_index->tile_index[it_tile].marker = NULL;
			}

			/* Tile part index*/
			l_cstr_index->tile_index[it_tile].nb_tps = p_j2k->cstr_index->tile_index[it_tile].nb_tps;

			l_cstr_index->tile_index[it_tile].tp_index =
				(opj_tp_index_t*)opj_malloc(l_cstr_index->tile_index[it_tile].nb_tps*sizeof(opj_tp_index_t));

			if(!l_cstr_index->tile_index[it_tile].tp_index){
				OPJ_UINT32 it_tile_free;

				for (it_tile_free=0; it_tile_free < it_tile; it_tile_free++){
					opj_free(l_cstr_index->tile_index[it_tile_free].marker);
					opj_free(l_cstr_index->tile_index[it_tile_free].tp_index);
				}

				opj_free( l_cstr_index->tile_index);
				opj_free( l_cstr_index->marker);
				opj_free( l_cstr_index);
				return NULL;
			}

			if (p_j2k->cstr_index->tile_index[it_tile].tp_index){
				memcpy(	l_cstr_index->tile_index[it_tile].tp_index,
						p_j2k->cstr_index->tile_index[it_tile].tp_index,
						l_cstr_index->tile_index[it_tile].nb_tps * sizeof(opj_tp_index_t) );
			}
			else{
				opj_free(l_cstr_index->tile_index[it_tile].tp_index);
				l_cstr_index->tile_index[it_tile].tp_index = NULL;
			}

			/* Packet index (NOT USED)*/
			l_cstr_index->tile_index[it_tile].nb_packet = 0;
			l_cstr_index->tile_index[it_tile].packet_index = NULL;

		}
	}

	return l_cstr_index;
}